

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# response.h
# Opt level: O0

void __thiscall webpp::Response::Response(Response *this,string *content,HttpStatus status)

{
  element_type *peVar1;
  ostream *poVar2;
  mapped_type *pmVar3;
  shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>_> local_58 [2];
  shared_ptr<boost::asio::basic_streambuf<std::allocator<char>_>_> local_38;
  ulong local_28;
  size_type len;
  string *psStack_18;
  HttpStatus status_local;
  string *content_local;
  Response *this_local;
  
  len._4_4_ = status;
  psStack_18 = content;
  content_local = (string *)this;
  std::shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>_>::shared_ptr
            (&this->response_stream);
  std::shared_ptr<boost::asio::basic_streambuf<std::allocator<char>_>_>::shared_ptr
            (&this->write_buffer);
  this->status = len._4_4_;
  local_28 = std::__cxx11::string::length();
  std::make_shared<boost::asio::basic_streambuf<std::allocator<char>>>();
  std::shared_ptr<boost::asio::basic_streambuf<std::allocator<char>_>_>::operator=
            (&this->write_buffer,&local_38);
  std::shared_ptr<boost::asio::basic_streambuf<std::allocator<char>_>_>::~shared_ptr(&local_38);
  std::__shared_ptr<boost::asio::basic_streambuf<std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ::get(&(this->write_buffer).
         super___shared_ptr<boost::asio::basic_streambuf<std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
       );
  std::make_shared<std::ostream,boost::asio::basic_streambuf<std::allocator<char>>*>
            ((basic_streambuf<std::allocator<char>_> **)local_58);
  std::shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>_>::operator=
            (&this->response_stream,local_58);
  std::shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>_>::~shared_ptr(local_58);
  peVar1 = std::
           __shared_ptr_access<std::basic_ostream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator*((__shared_ptr_access<std::basic_ostream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)this);
  poVar2 = std::operator<<((ostream *)peVar1,"HTTP/1.1 ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,len._4_4_);
  poVar2 = std::operator<<(poVar2," ");
  pmVar3 = std::
           map<webpp::http::HttpStatus,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<webpp::http::HttpStatus>,_std::allocator<std::pair<const_webpp::http::HttpStatus,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<webpp::http::HttpStatus,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<webpp::http::HttpStatus>,_std::allocator<std::pair<const_webpp::http::HttpStatus,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)http::HttpStatusMap_abi_cxx11_,(key_type *)((long)&len + 4));
  poVar2 = std::operator<<(poVar2,(string *)pmVar3);
  poVar2 = std::operator<<(poVar2,"\r\nContent-Length: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_28);
  poVar2 = std::operator<<(poVar2,"\r\n\r\n");
  std::operator<<(poVar2,(string *)psStack_18);
  return;
}

Assistant:

Response(const std::string&& content,
           const http::HttpStatus status = http::OK)
      : status(status) {
    auto len = content.length();
    write_buffer = std::make_shared<boost::asio::streambuf>();
    response_stream = std::make_shared<std::ostream>(write_buffer.get());

    *response_stream << "HTTP/1.1 " << status << " "
                     << http::HttpStatusMap[status]
                     << "\r\nContent-Length: " << len << "\r\n\r\n"
                     << content;
  }